

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O1

event * event_new(event_base *base,int fd,short events,_func_void_int_short_void_ptr *cb,void *arg)

{
  int iVar1;
  event *ev;
  
  if (mm_malloc_fn_ == (_func_void_ptr_size_t *)0x0) {
    ev = (event *)malloc(0x80);
  }
  else {
    ev = (event *)(*mm_malloc_fn_)(0x80);
  }
  if (ev != (event *)0x0) {
    iVar1 = event_assign(ev,base,fd,events,cb,arg);
    if (-1 < iVar1) {
      return ev;
    }
    if (mm_free_fn_ == (_func_void_void_ptr *)0x0) {
      free(ev);
    }
    else {
      (*mm_free_fn_)(ev);
    }
  }
  return (event *)0x0;
}

Assistant:

struct event *
event_new(struct event_base *base, evutil_socket_t fd, short events, void (*cb)(evutil_socket_t, short, void *), void *arg)
{
	struct event *ev;
	ev = mm_malloc(sizeof(struct event));
	if (ev == NULL)
		return (NULL);
	if (event_assign(ev, base, fd, events, cb, arg) < 0) {
		mm_free(ev);
		return (NULL);
	}

	return (ev);
}